

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

nvlist_t * nvlist_get_array_next(nvlist_t *nvl)

{
  nvpair_t *nvp;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x100,"const nvlist_t *nvlist_get_array_next(const nvlist_t *)");
  }
  if (nvl->nvl_magic == 0x6e766c) {
    if (nvl->nvl_array_next == (nvpair_t *)0x0) {
      nvl_local = (nvlist_t *)0x0;
    }
    else {
      nvl_local = nvpair_get_nvlist(nvl->nvl_array_next);
    }
    return nvl_local;
  }
  __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x100,"const nvlist_t *nvlist_get_array_next(const nvlist_t *)");
}

Assistant:

const nvlist_t *
nvlist_get_array_next(const nvlist_t *nvl)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);

	nvp = nvl->nvl_array_next;
	if (nvp == NULL)
		return (NULL);

	return (nvpair_get_nvlist(nvp));
}